

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  sexp_conflict psVar3;
  long lVar4;
  
  lVar2 = sexp_make_eval_context(0,0,0,0,0);
  sexp_load_standard_env(lVar2,0,0xf);
  psVar3 = (sexp_conflict)sexp_eval_string(lVar2,"(import (chibi net))",0xffffffffffffffff,0);
  check_exception(psVar3,"sexp_eval_string(ctx1, \"(import (chibi net))\", -1, NULL)");
  psVar3 = (sexp_conflict)sexp_eval_string(lVar2,"(import (chibi time))",0xffffffffffffffff,0);
  check_exception(psVar3,"sexp_eval_string(ctx1, \"(import (chibi time))\", -1, NULL)");
  lVar4 = sexp_make_eval_context(0,0,0,0,0);
  sexp_load_standard_env(lVar4,0,0xf);
  psVar3 = (sexp_conflict)sexp_eval_string(lVar4,"(import (chibi time))",0xffffffffffffffff,0);
  check_exception(psVar3,"sexp_eval_string(ctx2, \"(import (chibi time))\", -1, NULL)");
  psVar3 = (sexp_conflict)sexp_eval_string(lVar4,"(import (chibi net))",0xffffffffffffffff,0);
  check_exception(psVar3,"sexp_eval_string(ctx2, \"(import (chibi net))\", -1, NULL)");
  psVar3 = (sexp_conflict)sexp_eval_string(lVar2,"(seconds->time 0)",0xffffffffffffffff,0);
  check_exception(psVar3,"sexp_eval_string(ctx1, \"(seconds->time 0)\", -1, NULL)");
  lVar1 = *(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 0x28) + 0x20) + 0x10 +
                             (ulong)psVar3->tag * 8) + 8);
  fprintf(_stderr,"ctx1: %p (%d): %s\n",psVar3,
          (ulong)(-(uint)(((ulong)psVar3 & 3) != 0) | psVar3->tag),
          *(long *)(lVar1 + 8) + *(long *)(lVar1 + 0x10) + 0x10);
  psVar3 = (sexp_conflict)sexp_eval_string(lVar4,"(seconds->time 0)",0xffffffffffffffff,0);
  check_exception(psVar3,"sexp_eval_string(ctx2, \"(seconds->time 0)\", -1, NULL)");
  lVar1 = *(long *)(*(long *)(*(long *)(*(long *)(lVar4 + 0x28) + 0x20) + 0x10 +
                             (ulong)psVar3->tag * 8) + 8);
  fprintf(_stderr,"ctx2: %p (%d): %s\n",psVar3,
          (ulong)(-(uint)(((ulong)psVar3 & 3) != 0) | psVar3->tag),
          *(long *)(lVar1 + 8) + *(long *)(lVar1 + 0x10) + 0x10);
  sexp_destroy_context(lVar2);
  sexp_destroy_context(lVar4);
  return 0;
}

Assistant:

int main (int argc, char **argv) {
  sexp ctx1, ctx2, res;

  /* Create a context and load two modules with C types. */
  ctx1 = sexp_make_eval_context(NULL, NULL, NULL, 0, 0);
  sexp_load_standard_env(ctx1, NULL, SEXP_SEVEN);
  CHECK(sexp_eval_string(ctx1, "(import (chibi net))", -1, NULL));
  CHECK(sexp_eval_string(ctx1, "(import (chibi time))", -1, NULL));

  /* Create another context and load the same modules in a different order. */
  ctx2 = sexp_make_eval_context(NULL, NULL, NULL, 0, 0);
  sexp_load_standard_env(ctx2, NULL, SEXP_SEVEN);
  CHECK(sexp_eval_string(ctx2, "(import (chibi time))", -1, NULL));
  CHECK(sexp_eval_string(ctx2, "(import (chibi net))", -1, NULL));

  /* Both instances of seconds->time should return the same type, */
  /* but with different tags. */
  CHECK(sexp_eval_string(ctx1, "(seconds->time 0)", -1, NULL));
  fprintf(stderr, "ctx1: %p (%d): %s\n", res, sexp_safe_pointer_tag(res),
          sexp_string_data(sexp_object_type_name(ctx1, res)));

  CHECK(sexp_eval_string(ctx2, "(seconds->time 0)", -1, NULL));
  fprintf(stderr, "ctx2: %p (%d): %s\n", res, sexp_safe_pointer_tag(res),
          sexp_string_data(sexp_object_type_name(ctx2, res)));

  /* Cleanup. */
  sexp_destroy_context(ctx1);
  sexp_destroy_context(ctx2);

  return 0;
}